

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring_test.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_18f9de::CBBTest_Fixed_Test::TestBody(CBBTest_Fixed_Test *this)

{
  int iVar1;
  pointer *__ptr_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  uint8_t buf [1];
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar_;
  CBB cbb2;
  size_t out_size;
  uint8_t *out_buf;
  CBB cbb;
  AssertHelper local_c8;
  uint8_t local_b9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined1 local_88 [16];
  anon_union_32_2_4f6aaa2e_for_u local_78;
  AssertHelper local_58;
  size_t local_50;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  CBB local_40;
  
  iVar1 = CBB_init_fixed(&local_40,(uint8_t *)0x0,0);
  local_a8[0] = iVar1 != 0;
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)local_a8,
               (AssertionResult *)"CBB_init_fixed(&cbb, __null, 0)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x18e,(char *)CONCAT71(local_88._1_7_,local_88[0]));
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_b8);
  }
  else {
    iVar1 = CBB_finish(&local_40,(uint8_t **)&local_48,&local_50);
    local_a8[0] = iVar1 != 0;
    local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_88,(internal *)local_a8,
                 (AssertionResult *)"CBB_finish(&cbb, &out_buf, &out_size)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,399,(char *)CONCAT71(local_88._1_7_,local_88[0]));
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_b8);
    }
    else {
      local_a8 = (undefined1  [8])
                 local_48._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
      local_b8._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::internal::CmpHelperEQ<unsigned_char*,unsigned_char*>
                ((internal *)local_88,"__null","out_buf",(uchar **)&local_b8,(uchar **)local_a8);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_a8);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((_Alloc_hider *)local_88._8_8_)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,400,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)local_a8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
        if (local_a8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_a8 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_88 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_88._8_8_);
      }
      local_a8 = (undefined1  [8])((ulong)local_a8 & 0xffffffff00000000);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)local_88,"0u","out_size",(uint *)local_a8,&local_50);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_a8);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((_Alloc_hider *)local_88._8_8_)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x191,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)local_a8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
        if (local_a8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_a8 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_88 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_88._8_8_);
      }
      iVar1 = CBB_init_fixed(&local_40,&local_b9,1);
      local_a8[0] = iVar1 != 0;
      local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)&local_b8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_88,(internal *)local_a8,
                   (AssertionResult *)"CBB_init_fixed(&cbb, buf, 1)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x193,(char *)CONCAT71(local_88._1_7_,local_88[0]));
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_b8);
      }
      else {
        iVar1 = CBB_add_u8(&local_40,'\x01');
        local_a8[0] = iVar1 != 0;
        local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&local_b8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_88,(internal *)local_a8,
                     (AssertionResult *)"CBB_add_u8(&cbb, 1)","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_c8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x194,(char *)CONCAT71(local_88._1_7_,local_88[0]));
          testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_b8);
        }
        else {
          iVar1 = CBB_finish(&local_40,(uint8_t **)&local_48,&local_50);
          local_a8[0] = iVar1 != 0;
          local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_b8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_88,(internal *)local_a8,
                       (AssertionResult *)"CBB_finish(&cbb, &out_buf, &out_size)","false","true",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_c8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                       ,0x195,(char *)CONCAT71(local_88._1_7_,local_88[0]));
            testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_b8);
          }
          else {
            testing::internal::CmpHelperEQ<unsigned_char[1],unsigned_char*>
                      ((internal *)local_88,"buf","out_buf",(uchar (*) [1])&local_b9,
                       (uchar **)&local_48);
            if (local_88[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_a8);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_88._8_8_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = ((_Alloc_hider *)local_88._8_8_)->_M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_b8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                         ,0x196,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_b8,(Message *)local_a8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
              if (local_a8 != (undefined1  [8])0x0) {
                (**(code **)(*(size_type *)local_a8 + 8))();
              }
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)(local_88 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88._8_8_);
            }
            local_a8._0_4_ = 1;
            testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                      ((internal *)local_88,"1u","out_size",(uint *)local_a8,&local_50);
            if (local_88[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_a8);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_88._8_8_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = ((_Alloc_hider *)local_88._8_8_)->_M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_b8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                         ,0x197,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_b8,(Message *)local_a8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
              if (local_a8 != (undefined1  [8])0x0) {
                (**(code **)(*(long *)local_a8 + 8))();
              }
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)(local_88 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88._8_8_);
            }
            local_a8._0_4_ = 1;
            testing::internal::CmpHelperEQ<unsigned_int,unsigned_char>
                      ((internal *)local_88,"1u","buf[0]",(uint *)local_a8,&local_b9);
            if (local_88[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_a8);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_88._8_8_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = ((_Alloc_hider *)local_88._8_8_)->_M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_b8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                         ,0x198,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_b8,(Message *)local_a8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
              if (local_a8 != (undefined1  [8])0x0) {
                (**(code **)(*(long *)local_a8 + 8))();
              }
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)(local_88 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88._8_8_);
            }
            iVar1 = CBB_init_fixed(&local_40,&local_b9,1);
            local_a8[0] = iVar1 != 0;
            local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar1 == 0) {
              testing::Message::Message((Message *)&local_b8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_88,(internal *)local_a8,
                         (AssertionResult *)"CBB_init_fixed(&cbb, buf, 1)","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_c8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                         ,0x19a,(char *)CONCAT71(local_88._1_7_,local_88[0]));
              testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_b8);
            }
            else {
              iVar1 = CBB_add_u8(&local_40,'\x01');
              local_a8[0] = iVar1 != 0;
              local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar1 != 0) {
                iVar1 = CBB_add_u8(&local_40,'\x02');
                local_a8[0] = iVar1 == 0;
                local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (iVar1 != 0) {
                  testing::Message::Message((Message *)&local_b8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_88,(internal *)local_a8,
                             (AssertionResult *)"CBB_add_u8(&cbb, 2)","true","false",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_c8,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                             ,0x19c,(char *)CONCAT71(local_88._1_7_,local_88[0]));
                  testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_b8);
                  testing::internal::AssertHelper::~AssertHelper(&local_c8);
                  if ((anon_union_32_2_4f6aaa2e_for_u *)CONCAT71(local_88._1_7_,local_88[0]) !=
                      &local_78) {
                    operator_delete((anon_union_32_2_4f6aaa2e_for_u *)
                                    CONCAT71(local_88._1_7_,local_88[0]),
                                    (ulong)(local_78.base.buf + 1));
                  }
                  if (local_b8._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_b8._M_head_impl + 8))();
                  }
                }
                if (local_a0 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_a0,local_a0);
                }
                iVar1 = CBB_init_fixed((CBB *)local_88,&local_b9,1);
                local_b8._M_head_impl._0_1_ = iVar1 != 0;
                local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (iVar1 == 0) {
                  testing::Message::Message((Message *)&local_c8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_a8,(internal *)&local_b8,
                             (AssertionResult *)"CBB_init_fixed(&cbb2, buf, 1)","false","true",in_R9
                            );
                  testing::internal::AssertHelper::AssertHelper
                            (&local_58,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                             ,0x1a3,(char *)local_a8);
                  testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_c8);
                }
                else {
                  iVar1 = CBB_add_u8((CBB *)local_88,'\x01');
                  local_b8._M_head_impl._0_1_ = iVar1 != 0;
                  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (iVar1 != 0) {
                    iVar1 = CBB_add_u8((CBB *)local_88,'\x02');
                    local_b8._M_head_impl._0_1_ = iVar1 == 0;
                    local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x0;
                    if (iVar1 != 0) {
                      testing::Message::Message((Message *)&local_c8);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)local_a8,(internal *)&local_b8,
                                 (AssertionResult *)"CBB_add_u8(&cbb2, 2)","true","false",in_R9);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_58,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                                 ,0x1a5,(char *)local_a8);
                      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_c8);
                      testing::internal::AssertHelper::~AssertHelper(&local_58);
                      if (local_a8 != (undefined1  [8])&local_98) {
                        operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
                      }
                      if (local_c8.data_ != (AssertHelperData *)0x0) {
                        (**(code **)(*(long *)local_c8.data_ + 8))();
                      }
                    }
                    if (local_b0 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_b0,local_b0);
                    }
                    CBB_cleanup((CBB *)local_88);
                    return;
                  }
                  testing::Message::Message((Message *)&local_c8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_a8,(internal *)&local_b8,
                             (AssertionResult *)"CBB_add_u8(&cbb2, 1)","false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_58,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                             ,0x1a4,(char *)local_a8);
                  testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_c8);
                }
                this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_b0;
                testing::internal::AssertHelper::~AssertHelper(&local_58);
                if (local_a8 != (undefined1  [8])&local_98) {
                  operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
                }
                __ptr_00 = local_b0;
                if (local_c8.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_c8.data_ + 8))();
                  __ptr_00 = local_b0;
                }
                goto LAB_002196ed;
              }
              testing::Message::Message((Message *)&local_b8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_88,(internal *)local_a8,
                         (AssertionResult *)"CBB_add_u8(&cbb, 1)","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_c8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                         ,0x19b,(char *)CONCAT71(local_88._1_7_,local_88[0]));
              testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_b8);
            }
          }
        }
      }
    }
  }
  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_a0;
  testing::internal::AssertHelper::~AssertHelper(&local_c8);
  if ((anon_union_32_2_4f6aaa2e_for_u *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
    operator_delete((anon_union_32_2_4f6aaa2e_for_u *)CONCAT71(local_88._1_7_,local_88[0]),
                    (ulong)(local_78.base.buf + 1));
  }
  __ptr_00 = local_a0;
  if (local_b8._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_b8._M_head_impl + 8))();
    __ptr_00 = local_a0;
  }
LAB_002196ed:
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(this_00,__ptr_00);
  }
  return;
}

Assistant:

TEST(CBBTest, Fixed) {
  CBB cbb;
  uint8_t buf[1];
  uint8_t *out_buf;
  size_t out_size;

  ASSERT_TRUE(CBB_init_fixed(&cbb, NULL, 0));
  ASSERT_TRUE(CBB_finish(&cbb, &out_buf, &out_size));
  EXPECT_EQ(NULL, out_buf);
  EXPECT_EQ(0u, out_size);

  ASSERT_TRUE(CBB_init_fixed(&cbb, buf, 1));
  ASSERT_TRUE(CBB_add_u8(&cbb, 1));
  ASSERT_TRUE(CBB_finish(&cbb, &out_buf, &out_size));
  EXPECT_EQ(buf, out_buf);
  EXPECT_EQ(1u, out_size);
  EXPECT_EQ(1u, buf[0]);

  ASSERT_TRUE(CBB_init_fixed(&cbb, buf, 1));
  ASSERT_TRUE(CBB_add_u8(&cbb, 1));
  EXPECT_FALSE(CBB_add_u8(&cbb, 2));
  // We do not need |CBB_cleanup| or |bssl::ScopedCBB| here because a fixed
  // |CBB| has no allocations. Leak-checking tools will confirm there was
  // nothing to clean up.

  // However, it should be harmless to call |CBB_cleanup|.
  CBB cbb2;
  ASSERT_TRUE(CBB_init_fixed(&cbb2, buf, 1));
  ASSERT_TRUE(CBB_add_u8(&cbb2, 1));
  EXPECT_FALSE(CBB_add_u8(&cbb2, 2));
  CBB_cleanup(&cbb2);
}